

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SendPacket(RTPSession *this,RTPPacket *packet)

{
  uint8_t *data;
  size_t len;
  int status;
  RTPPacket *packet_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    data = RTPPacket::GetPacketData(packet);
    len = RTPPacket::GetPacketLength(packet);
    this_local._4_4_ = SendRTPData(this,data,len);
    if (-1 < this_local._4_4_) {
      RTPSources::SentRTPPacket(&(this->sources).super_RTPSources);
      this->sentpackets = true;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SendPacket(RTPPacket *packet) 
{
	int status;
	
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	BUILDER_LOCK
	if ((status = SendRTPData(packet->GetPacketData(), packet->GetPacketLength())) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	BUILDER_UNLOCK

	SOURCES_LOCK
	sources.SentRTPPacket();
	SOURCES_UNLOCK
	PACKSENT_LOCK
	sentpackets = true;
	PACKSENT_UNLOCK
	return 0;
}